

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::short_filename_formatter<spdlog::details::scoped_padder>::format
          (short_filename_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_3,
          memory_buf_t *dest)

{
  string_view_t view;
  bool bVar1;
  padding_info *ppVar2;
  long in_RSI;
  char *in_RDI;
  scoped_padder p;
  size_t text_size;
  char *filename;
  scoped_padder p_1;
  scoped_padder *in_stack_ffffffffffffff30;
  scoped_padder *this_00;
  memory_buf_t *in_stack_ffffffffffffff38;
  padding_info *in_stack_ffffffffffffff40;
  memory_buf_t *dest_00;
  scoped_padder *in_stack_ffffffffffffff50;
  char *local_a0;
  scoped_padder local_98;
  memory_buf_t *local_68;
  char *local_60;
  long local_20;
  char *local_10;
  char **local_8;
  
  local_20 = in_RSI;
  bVar1 = source_loc::empty((source_loc *)(in_RSI + 0x38));
  if (bVar1) {
    scoped_padder::scoped_padder
              (in_stack_ffffffffffffff50,(size_t)in_RDI,in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38);
    scoped_padder::~scoped_padder(in_stack_ffffffffffffff30);
  }
  else {
    local_60 = basename(*(char **)(local_20 + 0x38));
    bVar1 = padding_info::enabled((padding_info *)(in_RDI + 8));
    if (bVar1) {
      dest_00 = (memory_buf_t *)std::char_traits<char>::length((char_type *)0x1fc5e3);
    }
    else {
      dest_00 = (memory_buf_t *)0x0;
    }
    local_68 = dest_00;
    scoped_padder::scoped_padder
              (in_stack_ffffffffffffff50,(size_t)in_RDI,(padding_info *)dest_00,
               in_stack_ffffffffffffff38);
    local_8 = &local_a0;
    local_10 = local_60;
    local_a0 = local_60;
    this_00 = &local_98;
    ppVar2 = (padding_info *)std::char_traits<char>::length((char_type *)0x1fc660);
    this_00->padinfo_ = ppVar2;
    view.size_ = (size_t)in_stack_ffffffffffffff50;
    view.data_ = in_RDI;
    fmt_helper::append_string_view(view,dest_00);
    scoped_padder::~scoped_padder(this_00);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        if (msg.source.empty()) {
            ScopedPadder p(0, padinfo_, dest);
            return;
        }
        auto filename = basename(msg.source.filename);
        size_t text_size = padinfo_.enabled() ? std::char_traits<char>::length(filename) : 0;
        ScopedPadder p(text_size, padinfo_, dest);
        fmt_helper::append_string_view(filename, dest);
    }